

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

uint64_t __thiscall mkvmuxer::Cues::Size(Cues *this)

{
  uint64_t value;
  uint64 uVar1;
  uint64 value_00;
  long lVar2;
  
  if (this->cue_entries_size_ < 1) {
    value_00 = 0;
  }
  else {
    lVar2 = 0;
    value_00 = 0;
    do {
      value = CuePoint::PayloadSize(this->cue_entries_[lVar2]);
      uVar1 = EbmlMasterElementSize(0xbb,value);
      value_00 = value_00 + value + uVar1;
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->cue_entries_size_);
  }
  uVar1 = EbmlMasterElementSize(0x1c53bb6b,value_00);
  return uVar1 + value_00;
}

Assistant:

uint64_t Cues::Size() {
  uint64_t size = 0;
  for (int32_t i = 0; i < cue_entries_size_; ++i)
    size += GetCueByIndex(i)->Size();
  size += EbmlMasterElementSize(libwebm::kMkvCues, size);
  return size;
}